

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcMaj3.c
# Opt level: O2

void Zyx_PrintClause(int *pLits,int nLits)

{
  int iVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar3 = (ulong)(uint)nLits;
  if (nLits < 1) {
    uVar3 = 0;
  }
  for (uVar4 = 0; uVar3 != uVar4; uVar4 = uVar4 + 1) {
    iVar1 = Abc_LitIsCompl(pLits[uVar4]);
    uVar2 = Abc_Lit2Var(pLits[uVar4]);
    printf("%c%d ",(ulong)(iVar1 * 2 + 0x2b),(ulong)uVar2);
  }
  putchar(10);
  return;
}

Assistant:

void Zyx_PrintClause( int * pLits, int nLits )
{
    int i;
    for ( i = 0; i < nLits; i++ )
        printf( "%c%d ", Abc_LitIsCompl(pLits[i]) ? '-' : '+', Abc_Lit2Var(pLits[i]) );
    printf( "\n" );
}